

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraCodeBlocksGenerator::GetCBCompilerId_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmMakefile *mf)

{
  cmGlobalGenerator *this_00;
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  allocator local_133;
  undefined1 local_132;
  allocator local_131;
  undefined1 local_130 [8];
  string compilerId;
  string local_108;
  string local_e8 [8];
  string systemName;
  string local_c0;
  string local_a0 [8];
  string hostSystemName;
  string local_78;
  allocator local_41;
  undefined1 local_40 [8];
  string compilerIdVar;
  cmMakefile *mf_local;
  cmExtraCodeBlocksGenerator *this_local;
  string *compiler;
  
  compilerIdVar.field_2._8_8_ = mf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,"CMAKE_CXX_COMPILER_ID",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  this_00 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_78,"CXX",(allocator *)(hostSystemName.field_2._M_local_buf + 0xf));
  bVar2 = cmGlobalGenerator::GetLanguageEnabled(this_00,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)(hostSystemName.field_2._M_local_buf + 0xf));
  if (!bVar2) {
    std::__cxx11::string::operator=((string *)local_40,"CMAKE_C_COMPILER_ID");
  }
  uVar1 = compilerIdVar.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c0,"CMAKE_HOST_SYSTEM_NAME",
             (allocator *)(systemName.field_2._M_local_buf + 0xf));
  pcVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,pcVar3,(allocator *)(systemName.field_2._M_local_buf + 0xe))
  ;
  std::allocator<char>::~allocator((allocator<char> *)(systemName.field_2._M_local_buf + 0xe));
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)(systemName.field_2._M_local_buf + 0xf));
  uVar1 = compilerIdVar.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_108,"CMAKE_SYSTEM_NAME",
             (allocator *)(compilerId.field_2._M_local_buf + 0xf));
  pcVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,pcVar3,(allocator *)(compilerId.field_2._M_local_buf + 0xe))
  ;
  std::allocator<char>::~allocator((allocator<char> *)(compilerId.field_2._M_local_buf + 0xe));
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)(compilerId.field_2._M_local_buf + 0xf));
  pcVar3 = cmMakefile::GetSafeDefinition
                     ((cmMakefile *)compilerIdVar.field_2._8_8_,(string *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_130,pcVar3,&local_131);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  local_132 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"gcc",&local_133);
  std::allocator<char>::~allocator((allocator<char> *)&local_133);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_130,"MSVC");
  if (bVar2) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"msvc8");
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_130,"Borland");
    if (bVar2) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"bcc");
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_130,"SDCC");
      if (bVar2) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"sdcc");
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_130,"Intel");
        if (bVar2) {
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,"icc");
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_130,"Watcom");
          if ((bVar2) ||
             (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_130,"OpenWatcom"), bVar2)) {
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ow");
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_130,"GNU");
            if (bVar2) {
              std::__cxx11::string::operator=((string *)__return_storage_ptr__,"gcc");
            }
          }
        }
      }
    }
  }
  local_132 = 1;
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::GetCBCompilerId(const cmMakefile* mf)
{
  // figure out which language to use
  // for now care only for C and C++
  std::string compilerIdVar = "CMAKE_CXX_COMPILER_ID";
  if (this->GlobalGenerator->GetLanguageEnabled("CXX") == false)
    {
    compilerIdVar = "CMAKE_C_COMPILER_ID";
    }

  std::string hostSystemName = mf->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME");
  std::string systemName = mf->GetSafeDefinition("CMAKE_SYSTEM_NAME");
  std::string compilerId = mf->GetSafeDefinition(compilerIdVar);
  std::string compiler = "gcc";  // default to gcc
  if (compilerId == "MSVC")
    {
    compiler = "msvc8";
    }
  else if (compilerId == "Borland")
    {
    compiler = "bcc";
    }
  else if (compilerId == "SDCC")
    {
    compiler = "sdcc";
    }
  else if (compilerId == "Intel")
    {
    compiler = "icc";
    }
  else if (compilerId == "Watcom" || compilerId == "OpenWatcom")
    {
    compiler = "ow";
    }
  else if (compilerId == "GNU")
    {
    compiler = "gcc";
    }
  return compiler;
}